

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt64(Value *this)

{
  bool bVar1;
  byte bVar2;
  double *in_RDI;
  longlong val;
  Value *in_stack_000001a8;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string *str;
  bool local_59;
  string local_38 [32];
  longlong local_18;
  bool local_1;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 1:
  case 3:
    local_1 = true;
    break;
  case 2:
    local_1 = (ulong)*in_RDI < 0x8000000000000000;
    break;
  case 4:
    local_59 = false;
    if ((-9.223372036854776e+18 <= *in_RDI) &&
       (local_59 = false, *in_RDI <= 9.223372036854776e+18 && *in_RDI != 9.223372036854776e+18)) {
      local_59 = IsIntegral((double)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    }
    local_1 = local_59;
    break;
  case 5:
    str = local_38;
    asString_abi_cxx11_(in_stack_000001a8);
    std::__cxx11::string::c_str();
    bVar1 = converToInt64((char *)str,
                          (longlong *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
    ;
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string(local_38);
    if ((bVar2 & 1) == 0) {
      bVar1 = IsInRange<long_long,long_long,long_long>
                        (local_18,-0x8000000000000000,0x7fffffffffffffff);
      return bVar1;
    }
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case int64Value:
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  case stringValue:
    long long int val;

    if (!converToInt64 (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, minInt64, maxInt64);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}